

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O3

int nn_ws_handshake_hash_key(char *key,size_t key_len,char *hashed,size_t hashed_len)

{
  int iVar1;
  ulong uVar2;
  uint8_t *in;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  nn_sha1 hash;
  nn_sha1 local_84;
  
  nn_sha1_init(&local_84);
  if (key_len != 0) {
    uVar2 = 0;
    uVar3 = 1;
    do {
      nn_sha1_hashbyte(&local_84,key[uVar2]);
      bVar5 = uVar3 < key_len;
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar5);
  }
  lVar4 = 0;
  do {
    nn_sha1_hashbyte(&local_84,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11"[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x24);
  in = nn_sha1_result(&local_84);
  iVar1 = nn_base64_encode(in,0x14,hashed,0x1d);
  return iVar1;
}

Assistant:

static int nn_ws_handshake_hash_key (const char *key, size_t key_len,
    char *hashed, size_t hashed_len)
{
    int rc;
    unsigned i;
    struct nn_sha1 hash;

    nn_sha1_init (&hash);

    for (i = 0; i < key_len; i++)
        nn_sha1_hashbyte (&hash, key [i]);

    for (i = 0; i < strlen (NN_WS_HANDSHAKE_MAGIC_GUID); i++)
        nn_sha1_hashbyte (&hash, NN_WS_HANDSHAKE_MAGIC_GUID [i]);

    rc = nn_base64_encode (nn_sha1_result (&hash),
        sizeof (hash.state), hashed, hashed_len);

    return rc;
}